

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool re2::PCRE::Extract(StringPiece *text,PCRE *pattern,StringPiece *rewrite,string *out)

{
  int veclen;
  int local_108;
  int matches;
  int vec [51];
  string *out_local;
  StringPiece *rewrite_local;
  PCRE *pattern_local;
  StringPiece *text_local;
  
  memset(&local_108,0,0xcc);
  veclen = TryMatch(pattern,text,0,UNANCHORED,true,&local_108,0x33);
  if (veclen == 0) {
    text_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::clear();
    text_local._7_1_ = Rewrite(pattern,out,rewrite,text,&local_108,veclen);
  }
  return text_local._7_1_;
}

Assistant:

bool PCRE::Extract(const StringPiece &text,
                 const PCRE& pattern,
                 const StringPiece &rewrite,
                 string *out) {
  int vec[kVecSize] = {};
  int matches = pattern.TryMatch(text, 0, UNANCHORED, true, vec, kVecSize);
  if (matches == 0)
    return false;
  out->clear();
  return pattern.Rewrite(out, rewrite, text, vec, matches);
}